

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O2

void WavParserHelper::PrintFactChunk(FactChunk rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string Data;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Data,rhs.ckID,(allocator<char> *)&local_70);
  std::__cxx11::string::resize((ulong)&Data);
  std::operator+(&local_70,"ChunkID: ",&Data);
  PrintLog(&local_70,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::to_string(&local_50,rhs.ckSize);
  std::operator+(&local_70,"ChunkSize: ",&local_50);
  PrintLog(&local_70,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::to_string(&local_50,rhs.dwSampleLength);
  std::operator+(&local_70,"SampleLength: ",&local_50);
  PrintLog(&local_70,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&Data);
  return;
}

Assistant:

void WavParserHelper::PrintFactChunk(FactChunk rhs)
{
	//if not restrict size, there problem on \0 with char convert to string
	std::string Data(rhs.ckID);
	Data.resize(4);

	PrintLog("ChunkID: " + Data);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	PrintLog("SampleLength: " + std::to_string(rhs.dwSampleLength));

	std::cout << std::endl;
}